

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.c
# Opt level: O1

ASTList * ParseArgs(Scope *scope,Lexer *lexer)

{
  int iVar1;
  ASTListItem *pAVar2;
  Token TVar3;
  ASTNode *pAVar4;
  char *pcVar5;
  ASTListItem *pAVar6;
  ASTList *pAVar7;
  
  TVar3 = GetNextToken(lexer);
  if (TVar3 == LPAREN) {
    iVar1 = scope->paramsSpot;
    scope->paramsSpot = iVar1 + 1;
    if (iVar1 < scope->paramsLength) {
      pAVar7 = scope->params + iVar1;
    }
    else {
      pAVar7 = (ASTList *)0x0;
    }
    do {
      iVar1 = scope->paramItemsSpot;
      scope->paramItemsSpot = iVar1 + 1;
      if (iVar1 < scope->paramItemsLength) {
        pAVar6 = scope->paramItems + iVar1;
      }
      else {
        pAVar6 = (ASTListItem *)0x0;
      }
      pAVar4 = ParseExpression(scope,lexer);
      pAVar6->node = pAVar4;
      pAVar2 = pAVar7->current;
      pAVar6->prev = pAVar2;
      if (pAVar2 != (ASTListItem *)0x0) {
        pAVar2->next = pAVar6;
      }
      pAVar7->current = pAVar6;
      if (pAVar7->first == (ASTListItem *)0x0) {
        pAVar7->first = pAVar6;
      }
      TVar3 = GetCurrentToken(lexer);
    } while (TVar3 != RPAREN);
    pAVar7->last = pAVar7->current;
    return pAVar7;
  }
  pcVar5 = TokenToString(TVar3);
  printf("Parse error: Expected: %s, but got: %s, at %d:%d\n","LPAREN",pcVar5,
         (ulong)(uint)(lexer->tracker).row,
         (ulong)(((lexer->tracker).col + (lexer->tracker).currentTokenPosition) - 1));
  exit(0);
}

Assistant:

ASTList* ParseArgs(Scope* scope, Lexer* lexer){
	DEBUG_PRINT_SYNTAX("Func Args");
	TRACK();
	Token tok = GetNextToken(lexer);
	EXPECT_TOKEN(tok, LPAREN, lexer);
	ASTList* list = GetNextASTList(scope);

	while (tok != RPAREN){
		// tok = GetNextToken(lexer);
		ASTListItem* item = GetNextASTListItem(scope);
		item->node = ParseExpression(scope, lexer);
		item->prev = list->current;

		if (list->current != NULL) list->current->next = item;

		list->current = item;
		if (list->first == NULL) list->first = item;
		tok = GetCurrentToken(lexer);
	}
	list->last = list->current;

	return list;
}